

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

bool __thiscall
FOptionMenuScreenResolutionLine::SetString
          (FOptionMenuScreenResolutionLine *this,int i,char *newtext)

{
  uint uVar1;
  
  uVar1 = i - 0x30000;
  if (uVar1 < 3) {
    FString::operator=(this->mResTexts + uVar1,newtext);
    if (*(int *)(this->mResTexts[0].Chars + -0xc) == 0) {
      this->mMaxValid = -1;
    }
    else if (*(int *)(this->mResTexts[1].Chars + -0xc) == 0) {
      this->mMaxValid = 0;
    }
    else if (*(int *)(this->mResTexts[2].Chars + -0xc) == 0) {
      this->mMaxValid = 1;
    }
    else {
      this->mMaxValid = 2;
    }
  }
  return uVar1 < 3;
}

Assistant:

bool SetString(int i, const char *newtext)
	{
		if (i >= SRL_INDEX && i <= SRL_INDEX+2) 
		{
			mResTexts[i-SRL_INDEX] = newtext;
			if (mResTexts[0].IsEmpty()) mMaxValid = -1;
			else if (mResTexts[1].IsEmpty()) mMaxValid = 0;
			else if (mResTexts[2].IsEmpty()) mMaxValid = 1;
			else mMaxValid = 2;
			return true;
		}
		return false;
	}